

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O3

Ptr __thiscall TgBot::TgTypeParser::parseJsonAndGetMessageEntity(TgTypeParser *this,ptree *data)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  type_conflict4 tVar3;
  undefined8 *puVar4;
  self_type *psVar5;
  long *plVar6;
  iterator iVar7;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  path_type *data_00;
  dummy_u *pdVar9;
  Ptr PVar10;
  Ptr PVar11;
  path_type local_c8;
  type local_98;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  dummy_u local_50;
  
  puVar4 = (undefined8 *)operator_new(0x68);
  puVar4[1] = 0x100000001;
  *puVar4 = &PTR___Sp_counted_ptr_inplace_002a51d0;
  puVar4[6] = 0;
  puVar4[7] = 0;
  puVar4[4] = 0;
  puVar4[5] = 0;
  puVar4[8] = 0;
  puVar4[9] = 0;
  puVar4[10] = 0;
  puVar4[2] = puVar4 + 4;
  puVar4[3] = 0;
  puVar4[7] = puVar4 + 9;
  puVar4[0xb] = 0;
  puVar4[0xc] = 0;
  *(undefined8 **)(this + 8) = puVar4;
  *(string **)this = (string *)(puVar4 + 2);
  paVar1 = &local_c8.m_value.field_2;
  local_c8.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"type","");
  local_c8.m_separator = '.';
  local_c8.m_start._M_current = local_c8.m_value._M_dataplus._M_p;
  psVar5 = boost::property_tree::
           basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::get_child(in_RDX,&local_c8);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get_value<std::__cxx11::string,boost::property_tree::id_translator<std::__cxx11::string>>
            (&local_98,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)psVar5);
  std::__cxx11::string::operator=((string *)(puVar4 + 2),(string *)&local_98);
  if ((void *)CONCAT44(local_98._4_4_,local_98._0_4_) !=
      (void *)((long)&local_98.m_storage.dummy_ + 8)) {
    operator_delete((void *)CONCAT44(local_98._4_4_,local_98._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8.m_value._M_dataplus._M_p);
  }
  local_c8.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"offset","");
  local_c8.m_separator = '.';
  local_c8.m_start._M_current = local_c8.m_value._M_dataplus._M_p;
  psVar5 = boost::property_tree::
           basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::get_child(in_RDX,&local_c8);
  std::locale::locale((locale *)local_70);
  std::locale::locale((locale *)&local_98,(locale *)local_70);
  tVar3 = boost::property_tree::
          basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
          get_value<int,boost::property_tree::stream_translator<char,std::char_traits<char>,std::allocator<char>,int>>
                    ((basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                      *)psVar5,
                     (stream_translator<char,_std::char_traits<char>,_std::allocator<char>,_int> *)
                     &local_98);
  std::locale::~locale((locale *)&local_98);
  std::locale::~locale((locale *)local_70);
  *(type_conflict4 *)(puVar4 + 6) = tVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8.m_value._M_dataplus._M_p);
  }
  local_c8.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"length","");
  local_c8.m_separator = '.';
  local_c8.m_start._M_current = local_c8.m_value._M_dataplus._M_p;
  psVar5 = boost::property_tree::
           basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::get_child(in_RDX,&local_c8);
  std::locale::locale((locale *)local_70);
  std::locale::locale((locale *)&local_98,(locale *)local_70);
  tVar3 = boost::property_tree::
          basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
          get_value<int,boost::property_tree::stream_translator<char,std::char_traits<char>,std::allocator<char>,int>>
                    ((basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                      *)psVar5,
                     (stream_translator<char,_std::char_traits<char>,_std::allocator<char>,_int> *)
                     &local_98);
  std::locale::~locale((locale *)&local_98);
  std::locale::~locale((locale *)local_70);
  *(type_conflict4 *)((long)puVar4 + 0x34) = tVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8.m_value._M_dataplus._M_p);
  }
  local_c8.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"url","");
  local_c8.m_separator = '.';
  local_c8.m_start._M_current = local_c8.m_value._M_dataplus._M_p;
  local_50.aligner_ = (type)((long)local_50.data + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get_optional<std::__cxx11::string>
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_98,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)in_RDX,&local_c8);
  local_70[0] = local_60;
  pdVar9 = &local_50;
  if (local_98.m_initialized != false) {
    pdVar9 = &local_98.m_storage.dummy_;
  }
  plVar6 = (long *)(local_50.data + 8);
  if (local_98.m_initialized != false) {
    plVar6 = (long *)((long)&local_98.m_storage.dummy_ + 8);
  }
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pdVar9->aligner_,*plVar6 + (long)pdVar9->aligner_);
  if ((local_98.m_initialized == true) &&
     ((void *)CONCAT44(local_98.m_storage.dummy_._4_4_,local_98.m_storage.dummy_._0_4_) !=
      (void *)((long)&local_98.m_storage.dummy_ + 0x10))) {
    operator_delete((void *)CONCAT44(local_98.m_storage.dummy_._4_4_,local_98.m_storage.dummy_._0_4_
                                    ));
  }
  lVar2 = *(long *)this;
  std::__cxx11::string::operator=((string *)(lVar2 + 0x28),(string *)local_70);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  if (local_50.aligner_ != (type)((long)local_50.data + 0x10)) {
    operator_delete((void *)local_50.aligner_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8.m_value._M_dataplus._M_p);
  }
  local_c8.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"user","");
  data_00 = &local_c8;
  iVar7 = boost::multi_index::detail::
          ordered_index_impl<boost::multi_index::member<std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,std::__cxx11::string_const,&std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>::first>,std::less<std::__cxx11::string>,boost::multi_index::detail::nth_layer<2,std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::ordered_non_unique<boost::multi_index::tag<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string...,boost::multi_index::detail::ordered_non_unique_tag,boost::multi_index::detail::null_augment_policy>
          ::find<std::__cxx11::string>
                    ((ordered_index_impl<boost::multi_index::member<std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,std::__cxx11::string_const,&std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>::first>,std::less<std::__cxx11::string>,boost::multi_index::detail::nth_layer<2,std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::ordered_non_unique<boost::multi_index::tag<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string___,boost::multi_index::detail::ordered_non_unique_tag,boost::multi_index::detail::null_augment_policy>
                      *)((long)in_RDX->m_children + 0x10),&data_00->m_value);
  if (iVar7.node ==
      *(ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
        **)((long)in_RDX->m_children + 8)) {
    local_98.m_initialized = false;
    local_98._1_3_ = 0;
    local_98._4_4_ = 0;
    local_98.m_storage.dummy_._0_4_ = 0;
    local_98.m_storage.dummy_._4_4_ = 0;
    _Var8._M_pi = extraout_RDX;
  }
  else {
    PVar10 = parseJsonAndGetUser((TgTypeParser *)&local_98,(ptree *)data_00);
    _Var8 = PVar10.super___shared_ptr<TgBot::User,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar2 + 0x50);
  *(undefined4 *)(lVar2 + 0x48) = local_98._0_4_;
  *(undefined4 *)(lVar2 + 0x4c) = local_98._4_4_;
  *(undefined4 *)(lVar2 + 0x50) = local_98.m_storage.dummy_._0_4_;
  *(undefined4 *)(lVar2 + 0x54) = local_98.m_storage.dummy_._4_4_;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    _Var8._M_pi = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8.m_value._M_dataplus._M_p);
    _Var8._M_pi = extraout_RDX_01;
  }
  PVar11.super___shared_ptr<TgBot::MessageEntity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var8._M_pi;
  PVar11.super___shared_ptr<TgBot::MessageEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar11.super___shared_ptr<TgBot::MessageEntity,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

MessageEntity::Ptr TgTypeParser::parseJsonAndGetMessageEntity(const ptree& data) const{
    auto result(make_shared<MessageEntity>());
    result->type = data.get<string>("type");
    result->offset = data.get<int32_t>("offset");
    result->length = data.get<int32_t>("length");
    result->url = data.get<string>("url", "");
    result->user = tryParseJson<User>(&TgTypeParser::parseJsonAndGetUser, data, "user");
    return result;
}